

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_regex.hpp
# Opt level: O2

void __thiscall iutest::detail::iuRegex::~iuRegex(iuRegex *this)

{
  std::__cxx11::string::~string((string *)&this->m_pattern);
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex(&this->m_re);
  return;
}

Assistant:

iuRegex(const char* pattern) { Init(pattern); }